

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreval.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  long lVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar9;
  double dVar10;
  undefined1 auVar11 [16];
  Exception *e;
  exception *e_2;
  string file_path_1;
  exception *e_1;
  string file_path;
  ulong local_268;
  size_t j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  value_type custom_operator_1;
  size_t i_1;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *custom_table;
  string symbol;
  value_type local_17c;
  string local_178 [8];
  string arg;
  ulong local_158;
  size_t i;
  size_t n_arg;
  CustomOperator custom_operator;
  string local_a8 [52];
  int local_74;
  int local_70;
  int option_index;
  int interactive_flag;
  int c;
  string str;
  undefined1 local_48 [8];
  Expression expr;
  char **argv_local;
  int argc_local;
  
  expr._40_8_ = argv;
  ExprEval::Expression::Expression((Expression *)local_48);
  std::__cxx11::string::string((string *)&interactive_flag);
  local_70 = 0;
  while( true ) {
    if ((main::long_options == '\0') &&
       (iVar2 = __cxa_guard_acquire(&main::long_options), iVar2 != 0)) {
      main::long_options[0].name = "interactive";
      main::long_options[0].has_arg = 0;
      main::long_options[0].flag = &local_70;
      main::long_options[0].val = 1;
      memset(main::long_options + 1,0,0x20);
      __cxa_guard_release(&main::long_options);
    }
    local_74 = 0;
    option_index = getopt_long(argc,expr._40_8_,"i:",main::long_options,&local_74);
    if (option_index == -1) break;
    if (option_index == 0) {
      if (main::long_options[local_74].flag == (int *)0x0) {
        printf("option %s");
        if (_optarg != (char *)0x0) {
          printf(" with arg %s");
        }
        printf("\n");
      }
    }
    else if (option_index != 0x3f) {
      if (option_index != 0x69) {
        abort();
      }
      poVar3 = std::operator<<((ostream *)&std::cout," = ");
      pcVar4 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar4,(allocator *)&custom_operator.field_0x97);
      dVar10 = ExprEval::Expression::evaluate((Expression *)local_48,(string *)local_a8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar10);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&custom_operator.field_0x97);
LAB_00115865:
      custom_operator._144_4_ = 1;
      std::__cxx11::string::~string((string *)&interactive_flag);
      ExprEval::Expression::~Expression((Expression *)local_48);
      return 0;
    }
  }
  if (_optind < argc) {
    printf("non-option ARGV-elements: ");
    while (_optind < argc) {
      lVar8 = (long)_optind;
      _optind = _optind + 1;
      printf("%s ",*(undefined8 *)(expr._40_8_ + lVar8 * 8));
    }
    putchar(10);
  }
  if (local_70 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"(Enter \'h\' for help)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    std::operator<<((ostream *)&std::cout,": ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&interactive_flag);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
    if (*pcVar4 == 'q') break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
    if ((*pcVar4 == '>') && (local_70 != 0)) {
      ExprEval::Operator::CustomOperator::CustomOperator((CustomOperator *)&n_arg);
      std::operator<<((ostream *)&std::cout,"\t> Symbol: ");
      std::operator>>((istream *)&std::cin,(string *)&custom_operator);
      std::operator<<((ostream *)&std::cout,"\t> # Args: ");
      std::istream::operator>>((istream *)&std::cin,&i);
      for (local_158 = 1; local_158 <= i; local_158 = local_158 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\t> Variable [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_158);
        std::operator<<(poVar3,"]: ");
        std::__cxx11::string::string(local_178);
        std::operator>>((istream *)&std::cin,local_178);
        pcVar4 = (char *)std::__cxx11::string::back();
        if (*pcVar4 == '_') {
          local_17c = (value_type)local_158;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &custom_operator.variables.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_17c);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&custom_operator.field_0x20,(value_type *)local_178);
          custom_operator._144_4_ = 0;
        }
        else {
          std::operator<<((ostream *)&std::cout,
                          " ! [Variable names should end with underscore(_)]\n");
          local_158 = local_158 - 1;
          custom_operator._144_4_ = 0xb;
        }
        std::__cxx11::string::~string(local_178);
      }
      std::operator<<((ostream *)&std::cout,"\t> Expression: ");
      std::operator>>((istream *)&std::cin,
                      (string *)
                      &custom_operator.arg_positions.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      ExprEval::Operator::add_custom_operator((CustomOperator *)&n_arg);
      std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
      std::istream::ignore();
      custom_operator._144_4_ = 7;
      ExprEval::Operator::CustomOperator::~CustomOperator((CustomOperator *)&n_arg);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
      if ((*pcVar4 == '<') && (local_70 != 0)) {
        std::__cxx11::string::string((string *)&custom_table);
        std::operator<<((ostream *)&std::cout," < Symbol: ");
        std::operator>>((istream *)&std::cin,(string *)&custom_table);
        ExprEval::Operator::remove_custom_operator((string *)&custom_table);
        std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
        std::istream::ignore();
        custom_operator._144_4_ = 7;
        std::__cxx11::string::~string((string *)&custom_table);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
        if ((*pcVar4 == '?') && (local_70 != 0)) {
          this = ExprEval::Operator::get_custom_table();
          for (custom_operator_1._144_8_ = 0; uVar1 = custom_operator_1._144_8_,
              sVar5 = std::
                      vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                      ::size(this), (ulong)uVar1 < sVar5;
              custom_operator_1._144_8_ = custom_operator_1._144_8_ + 1) {
            pvVar6 = std::
                     vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                     ::at(this,custom_operator_1._144_8_);
            ExprEval::Operator::CustomOperator::CustomOperator
                      ((CustomOperator *)
                       &args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&j,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&custom_operator_1.field_0x20);
            poVar3 = std::operator<<((ostream *)&std::cout,"\t- ");
            poVar3 = std::operator<<(poVar3,(string *)&custom_operator_1);
            std::operator<<(poVar3,"(");
            for (local_268 = 0;
                sVar5 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&j), local_268 < sVar5; local_268 = local_268 + 1) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&j,local_268);
              std::operator<<((ostream *)&std::cout,(string *)pvVar7);
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&j);
              if (local_268 < sVar5 - 1) {
                std::operator<<((ostream *)&std::cout,", ");
              }
            }
            poVar3 = std::operator<<((ostream *)&std::cout,") = ");
            poVar3 = std::operator<<(poVar3,(string *)
                                            &custom_operator_1.arg_positions.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_end_of_storage);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&j);
            ExprEval::Operator::CustomOperator::~CustomOperator
                      ((CustomOperator *)
                       &args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
          if ((*pcVar4 == 's') && (local_70 != 0)) {
            std::__cxx11::string::string((string *)&e_1);
            std::operator<<((ostream *)&std::cout,"\t[w] File path(default: operators.spec): ");
            pcVar4 = (char *)&e_1;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)pcVar4);
            auVar11 = std::__cxx11::string::empty();
            sVar9 = auVar11._8_8_;
            if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar4 = "operators.spec";
              std::__cxx11::string::operator=((string *)&e_1,"operators.spec");
              sVar9 = extraout_RDX;
            }
            ExprEval::Operator::BaseSpecification::write((int)&e_1,pcVar4,sVar9);
            std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
            custom_operator._144_4_ = 7;
            std::__cxx11::string::~string((string *)&e_1);
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
            if ((*pcVar4 == 'l') && (local_70 != 0)) {
              std::__cxx11::string::string((string *)&e_2);
              std::operator<<((ostream *)&std::cout,"\t[r] File path(default: operators.spec): ");
              pcVar4 = (char *)&e_2;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)pcVar4);
              auVar11 = std::__cxx11::string::empty();
              sVar9 = auVar11._8_8_;
              if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pcVar4 = "operators.spec";
                std::__cxx11::string::operator=((string *)&e_2,"operators.spec");
                sVar9 = extraout_RDX_00;
              }
              ExprEval::Operator::BaseSpecification::read((int)&e_2,pcVar4,sVar9);
              std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
              custom_operator._144_4_ = 7;
              std::__cxx11::string::~string((string *)&e_2);
            }
            else {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&interactive_flag);
              if ((*pcVar4 == 'h') && (local_70 != 0)) {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "\t| Use \'>\' to add a new operator/function;");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "\t| Use \'<\' to remove an operator/function;");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "\t| Use \'?\' to list all the user-defined operators/functions;"
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "\t| Use \'s\' to save all the user-defined operators/functions;"
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "\t| Use \'l\' to load all the user-defined operators/functions;"
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                poVar3 = std::operator<<((ostream *)&std::cout,"\t| Use \'q\' to quit.");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cout," = ");
                dVar10 = ExprEval::Expression::evaluate
                                   ((Expression *)local_48,(string *)&interactive_flag);
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar10);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00115865;
}

Assistant:

int main(int argc, char** argv){
    ExprEval::Expression expr;
    string str;

    // ExprEval::Function f({"x", "y"}, "x*y/100");
    // ExprEval::Function g({"x[0]", "x[1]"}, f.get({"x[0]-x[1]", "80-x[1]"}) + "+x[0]*x[1]");

    // try
    // {
    //     cout << f.get({4, 50}) << " = " << f({4, 50}) << endl;
    //     cout << g.get({4, 50}) << " = " << g({4, 50}) << endl;

    //     g.set({"x"}, "3*x+2");
    //     cout << g.get({4}) << " = " << g({4}) << endl;
    // }
    // catch(const ExprEval::Engine::Exception& e)
    // {
    //     std::cerr << e.what() << '\n';
    // }

    int c;
    int interactive_flag = 0;

    while (1){
        static struct option long_options[] =
        {
            {"interactive",   no_argument,       &interactive_flag, 1},
            {0, 0, 0, 0}
        };
    
        /* getopt_long stores the option index here. */
        int option_index = 0;
        c = getopt_long(argc, argv, "i:", long_options, &option_index);

        /* Detect the end of the options. */
        if (c == -1)
            break;

        switch (c)
            {
            case 0:
            /* If this option set a flag, do nothing else now. */
                if (long_options[option_index].flag != 0)
                    break;
                printf ("option %s", long_options[option_index].name);
                if (optarg)
                    printf (" with arg %s", optarg);
                printf ("\n");
                break;

            case 'i':
                cout << " = " << expr.evaluate(string(optarg)) << endl;
                // puts ("option -i\n");
                return 0;

            case '?':
                /* getopt_long already printed an error message. */
                break;

            default:
                abort ();
            }
        }

    /* Print any remaining command line arguments (not options). */
    if (optind < argc)
    {
        printf ("non-option ARGV-elements: ");
        while (optind < argc)
            printf ("%s ", argv[optind++]);
        putchar ('\n');
    }

    if(interactive_flag){
        cout << "(Enter 'h' for help)" << endl;
    }

    while(1){
        cout<<": ";
        getline(cin, str);
        if(str[0] == 'q') break;
        else if(str[0] == '>' && interactive_flag){
            ExprEval::Operator::CustomOperator custom_operator;
            size_t n_arg;

            cout<<"\t> Symbol: ";
            cin>>custom_operator.symbol;
            cout<<"\t> # Args: ";
            cin>>n_arg;
            for(size_t i=1; i<=n_arg; ++i){
                cout<<"\t> Variable ["<<i<<"]: ";
                string arg;
                cin>>arg;
                if(arg.back() != '_'){
                    cout<<" ! [Variable names should end with underscore(_)]\n";
                    i -= 1;
                    continue;
                }
                custom_operator.arg_positions.push_back(i);
                custom_operator.variables.push_back(arg);
            }
            cout<<"\t> Expression: ";
            cin>>custom_operator.expression;

            ExprEval::Operator::add_custom_operator(custom_operator);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '<' && interactive_flag){
            string symbol;
            cout<<" < Symbol: ";
            cin>>symbol;
            ExprEval::Operator::remove_custom_operator(symbol);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '?' && interactive_flag){
            auto custom_table = ExprEval::Operator::get_custom_table();
            for(size_t i=0; i<custom_table->size(); ++i){
                auto custom_operator = custom_table->at(i);
                auto args = custom_operator.variables;

                cout<<"\t- "<<custom_operator.symbol<<"(";
                for(size_t j=0; j<args.size(); ++j){
                    cout<<args[j];
                    if(j < args.size()-1) cout<<", ";
                }
                cout<<") = "<<custom_operator.expression<<endl;
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 's' && interactive_flag){
            string file_path;

            cout << "\t[w] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::write(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'l' && interactive_flag){
            string file_path;

            cout << "\t[r] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::read(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'h' && interactive_flag){
            cout << "\t| Use '>' to add a new operator/function;" << endl;
            cout << "\t| Use '<' to remove an operator/function;" << endl;
            cout << "\t| Use '?' to list all the user-defined operators/functions;" << endl;
            cout << "\t| Use 's' to save all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'l' to load all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'q' to quit." << endl;
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        }
        
        try
        {
            cout<<" = "<<expr.evaluate(str)<<endl;
        }
        catch(const ExprEval::Engine::Exception& e)
        {
            std::cerr << e.what() << '\n';
        }
    }

    return 0;
}